

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQInteger default_delegate_tofloat(HSQUIRRELVM v)

{
  SQObjectType SVar1;
  long lVar2;
  bool bVar3;
  SQObjectPtr *pSVar4;
  SQRESULT SVar5;
  SQObjectPtr res;
  SQObjectPtr local_20;
  
  pSVar4 = stack_get(v,1);
  SVar1 = (pSVar4->super_SQObject)._type;
  if (SVar1 == OT_BOOL) {
    if ((pSVar4->super_SQObject)._unVal.pTable == (SQTable *)0x0) {
      res.super_SQObject._unVal.fFloat = (SQFloat)0;
    }
    else {
      res.super_SQObject._unVal.fFloat = (SQFloat)0x3f800000;
    }
    res.super_SQObject._type = OT_FLOAT;
    res.super_SQObject._unVal.nInteger._4_4_ = 0;
    SQVM::Push(v,&res);
  }
  else if ((SVar1 == OT_INTEGER) || (SVar1 == OT_FLOAT)) {
    lVar2 = (pSVar4->super_SQObject)._unVal.nInteger;
    if (SVar1 == OT_INTEGER) {
      res.super_SQObject._unVal.fFloat = (SQFloat)lVar2;
    }
    else {
      res.super_SQObject._unVal.fFloat = (SQFloat)(int)lVar2;
    }
    res.super_SQObject._type = OT_FLOAT;
    res.super_SQObject._unVal.nInteger._4_4_ = 0;
    SQVM::Push(v,&res);
  }
  else {
    if (SVar1 != OT_STRING) {
      SQVM::PushNull(v);
      return 1;
    }
    res.super_SQObject._type = OT_NULL;
    res.super_SQObject._unVal.pTable = (SQTable *)0x0;
    bVar3 = str2num(((pSVar4->super_SQObject)._unVal.pString)->_val,&res,10);
    if (!bVar3) {
      SQObjectPtr::~SQObjectPtr(&res);
      SVar5 = sq_throwerror(v,"cannot convert the string");
      return SVar5;
    }
    if (res.super_SQObject._type == OT_INTEGER) {
      local_20.super_SQObject._unVal.fFloat = (SQFloat)res.super_SQObject._unVal.nInteger;
    }
    else {
      local_20.super_SQObject._unVal.fFloat = res.super_SQObject._unVal.fFloat;
    }
    local_20.super_SQObject._type = OT_FLOAT;
    local_20.super_SQObject._unVal.nInteger._4_4_ = 0;
    SQVM::Push(v,&local_20);
    SQObjectPtr::~SQObjectPtr(&local_20);
  }
  SQObjectPtr::~SQObjectPtr(&res);
  return 1;
}

Assistant:

static SQInteger default_delegate_tofloat(HSQUIRRELVM v)
{
    SQObjectPtr &o=stack_get(v,1);
    switch(sq_type(o)){
    case OT_STRING:{
        SQObjectPtr res;
        if(str2num(_stringval(o),res,10)){
            v->Push(SQObjectPtr(tofloat(res)));
            break;
        }}
        return sq_throwerror(v, _SC("cannot convert the string"));
        break;
    case OT_INTEGER:case OT_FLOAT:
        v->Push(SQObjectPtr(tofloat(o)));
        break;
    case OT_BOOL:
        v->Push(SQObjectPtr((SQFloat)(_integer(o)?1:0)));
        break;
    default:
        v->PushNull();
        break;
    }
    return 1;
}